

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O2

sector_t_conflict * __thiscall sector_t::FindModelFloorSector(sector_t *this,double floordestheight)

{
  sector_t_conflict *psVar1;
  long lVar2;
  double dVar3;
  
  lVar2 = 0;
  do {
    if (this->linecount <= lVar2) {
      return (sector_t_conflict *)0x0;
    }
    psVar1 = getNextSector(this->lines[lVar2],(sector_t_conflict *)this);
    if (psVar1 != (sector_t_conflict *)0x0) {
      dVar3 = secplane_t::ZatPoint(&psVar1->floorplane,this->lines[lVar2]->v1);
      if ((dVar3 == floordestheight) && (!NAN(dVar3) && !NAN(floordestheight))) {
        return psVar1;
      }
      dVar3 = secplane_t::ZatPoint(&psVar1->floorplane,this->lines[lVar2]->v2);
      if ((dVar3 == floordestheight) && (!NAN(dVar3) && !NAN(floordestheight))) {
        return psVar1;
      }
    }
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

sector_t *sector_t::FindModelFloorSector (double floordestheight) const
{
	int i;
	sector_t *sec;

	//jff 5/23/98 don't disturb sec->linecount while searching
	// but allow early exit in old demos
	for (i = 0; i < linecount; i++)
	{
		sec = getNextSector (lines[i], this);
		if (sec != NULL &&
			(sec->floorplane.ZatPoint(lines[i]->v1) == floordestheight ||
			 sec->floorplane.ZatPoint(lines[i]->v2) == floordestheight))
		{
			return sec;
		}
	}
	return NULL;
}